

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall DropdownMenu::draw(DropdownMenu *this,RenderTarget *target,RenderStates states)

{
  pointer pTVar1;
  Transform *right;
  TextButton *b;
  pointer drawable;
  
  right = sf::Transformable::getTransform(&(this->super_UIComponent).super_Transformable);
  sf::operator*=(&states.transform,right);
  sf::RenderTarget::draw(target,(Drawable *)&this->button,&states);
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    sf::RenderTarget::draw(target,(Drawable *)&this->background,&states);
    pTVar1 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (drawable = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
                    _M_impl.super__Vector_impl_data._M_start; drawable != pTVar1;
        drawable = drawable + 1) {
      sf::RenderTarget::draw(target,(Drawable *)drawable,&states);
    }
  }
  return;
}

Assistant:

void DropdownMenu::draw(RenderTarget& target, RenderStates states) const {
    states.transform *= getTransform();
    target.draw(button, states);
    if (visible) {
        target.draw(background, states);
        for (const TextButton& b : menuButtons) {
            target.draw(b, states);
        }
    }
}